

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::BuiltinPrecisionTests::FuncCaseBase::iterate(FuncCaseBase *this)

{
  bool bVar1;
  RenderContext *context;
  ContextInfo *pCVar2;
  ulong uVar3;
  char *name;
  NotSupportedError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DefaultDeleter<glu::ContextInfo> local_21;
  undefined1 local_20 [8];
  MovePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> info;
  FuncCaseBase *this_local;
  
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ = this
  ;
  context = PrecisionCase::getRenderContext(&this->super_PrecisionCase);
  pCVar2 = glu::ContextInfo::create(context);
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter(&local_21);
  de::details::MovePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::MovePtr
            ((MovePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20,pCVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pCVar2 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
             operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                        local_20);
    name = (char *)std::__cxx11::string::c_str();
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,name);
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::operator+(&local_58,"Unsupported extension: ",&(this->super_PrecisionCase).m_extension);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_58);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  (*(this->super_PrecisionCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  tcu::ResultCollector::setTestContextResult
            (&(this->super_PrecisionCase).m_status,
             (this->super_PrecisionCase).super_TestCase.super_TestNode.m_testCtx);
  de::details::MovePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~MovePtr
            ((MovePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20);
  return STOP;
}

Assistant:

IterateResult FuncCaseBase::iterate (void)
{
	MovePtr<ContextInfo>	info	(ContextInfo::create(getRenderContext()));

	if (!m_extension.empty() && !info->isExtensionSupported(m_extension.c_str()))
		throw NotSupportedError("Unsupported extension: " + m_extension);

	runTest();

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}